

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O3

pos_type __thiscall
zstr::istreambuf::seekoff(istreambuf *this,off_type off,seekdir dir,openmode which)

{
  z_stream_wrapper *pzVar1;
  uLong uVar2;
  long lVar3;
  ulong uVar4;
  pos_type pVar5;
  
  uVar4 = 0xffffffffffffffff;
  if (dir == _S_cur && off == 0) {
    pzVar1 = (this->zstrm_p)._M_t.
             super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
             .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl;
    if (pzVar1 == (z_stream_wrapper *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar2 = (pzVar1->super_z_stream).total_out;
      lVar3 = *(long *)&this->field_0x18 - *(long *)&this->field_0x10;
      if (lVar3 == 0) {
        lVar3 = (**(code **)(*(long *)this + 0x38))();
      }
      uVar4 = uVar2 - lVar3;
    }
  }
  pVar5._M_state.__count = 0;
  pVar5._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  pVar5._M_off = uVar4;
  return pVar5;
}

Assistant:

pos_type seekoff(off_type off, std::ios_base::seekdir dir,
                   std::ios_base::openmode which) override {
    if (off != 0 || dir != std::ios_base::cur) {
      return std::streambuf::seekoff(off, dir, which);
    }

    if (!zstrm_p) {
      return 0;
    }

    return static_cast<long int>(zstrm_p->total_out -
                                 static_cast<uLong>(in_avail()));
  }